

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Encoder.cpp
# Opt level: O2

void __thiscall Encoder::SaveLazyBailOutJitTransferData(Encoder *this)

{
  Func *pFVar1;
  Type pSVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  StackSym *pSVar6;
  InProcNativeEntryPointData *this_00;
  Memory *this_01;
  int *piVar7;
  JitTransferData *pJVar8;
  int *piVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  int count;
  uint uVar13;
  undefined1 local_50 [8];
  TrackAllocData data;
  
  bVar4 = Func::HasLazyBailOut(this->m_func);
  if (bVar4) {
    if ((this->m_sortedLazyBailoutRecordList->
        super_ReadOnlyList<LazyBailOutRecord,_Memory::ArenaAllocator,_DefaultComparer>).count < 1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Encoder.cpp"
                         ,0x69c,"(this->m_sortedLazyBailoutRecordList->Count() > 0)",
                         "this->m_sortedLazyBailoutRecordList->Count() > 0");
      if (!bVar4) goto LAB_003f2096;
      *puVar5 = 0;
    }
    if (this->m_lazyBailOutThunkOffset == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Encoder.cpp"
                         ,0x69d,"(this->m_lazyBailOutThunkOffset != 0)",
                         "this->m_lazyBailOutThunkOffset != 0");
      if (!bVar4) goto LAB_003f2096;
      *puVar5 = 0;
    }
    pSVar6 = Func::GetLazyBailOutRecordSlot(this->m_func);
    if (pSVar6 == (StackSym *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Encoder.cpp"
                         ,0x69e,"(this->m_func->GetLazyBailOutRecordSlot() != nullptr)",
                         "this->m_func->GetLazyBailOutRecordSlot() != nullptr");
      if (!bVar4) {
LAB_003f2096:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar5 = 0;
    }
    this_00 = Js::EntryPointInfo::GetInProcNativeEntryPointData(this->m_func->m_entryPointInfo);
    InProcNativeEntryPointData::SetSortedLazyBailOutRecordList
              (this_00,this->m_sortedLazyBailoutRecordList);
    pSVar6 = Func::GetLazyBailOutRecordSlot(this->m_func);
    InProcNativeEntryPointData::SetLazyBailOutRecordSlotOffset(this_00,pSVar6->m_offset);
    InProcNativeEntryPointData::SetLazyBailOutThunkOffset(this_00,this->m_lazyBailOutThunkOffset);
  }
  uVar13 = (this->m_func->lazyBailoutProperties).
           super_BaseDictionary<int,_int,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
           .count - (this->m_func->lazyBailoutProperties).
                    super_BaseDictionary<int,_int,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                    .freeCount;
  if (0 < (int)uVar13) {
    local_50 = (undefined1  [8])&int::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.count = (size_t)anon_var_dwarf_b47a24;
    data.filename._0_4_ = 0x6a9;
    data.plusSize = (ulong)uVar13;
    this_01 = (Memory *)
              Memory::HeapAllocator::TrackAllocInfo
                        (&Memory::HeapAllocator::Instance,(TrackAllocData *)local_50);
    piVar7 = Memory::AllocateArray<Memory::HeapAllocator,int,false>
                       (this_01,(HeapAllocator *)Memory::HeapAllocator::AllocZero,0,(ulong)uVar13);
    pFVar1 = this->m_func;
    piVar9 = piVar7;
    for (uVar12 = 0;
        uVar12 < (pFVar1->lazyBailoutProperties).
                 super_BaseDictionary<int,_int,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                 .bucketCount; uVar12 = uVar12 + 1) {
      iVar10 = (pFVar1->lazyBailoutProperties).
               super_BaseDictionary<int,_int,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
               .buckets[uVar12];
      if (iVar10 != -1) {
        while (iVar10 != -1) {
          pSVar2 = (pFVar1->lazyBailoutProperties).
                   super_BaseDictionary<int,_int,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                   .entries;
          lVar11 = (long)iVar10;
          iVar10 = pSVar2[iVar10].
                   super_DefaultHashedEntry<int,_int,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
                   .super_ImplicitKeyValueEntry<int,_int>.
                   super_ValueEntry<int,_JsUtil::(anonymous_namespace)::ValueEntryData<int>_>.
                   super_ValueEntryData<int>.next;
          *piVar9 = pSVar2[lVar11].
                    super_DefaultHashedEntry<int,_int,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
                    .super_ImplicitKeyValueEntry<int,_int>.
                    super_ValueEntry<int,_JsUtil::(anonymous_namespace)::ValueEntryData<int>_>.
                    super_ValueEntryData<int>.value;
          piVar9 = piVar9 + 1;
        }
      }
    }
    pJVar8 = Js::EntryPointInfo::GetJitTransferData(pFVar1->m_entryPointInfo);
    pJVar8->lazyBailoutProperties = piVar7;
    pJVar8->lazyBailoutPropertyCount = uVar13;
  }
  return;
}

Assistant:

void
Encoder::SaveLazyBailOutJitTransferData()
{
    if (this->m_func->HasLazyBailOut())
    {
        Assert(this->m_sortedLazyBailoutRecordList->Count() > 0);
        Assert(this->m_lazyBailOutThunkOffset != 0);
        Assert(this->m_func->GetLazyBailOutRecordSlot() != nullptr);

        auto nativeEntryPointData = this->m_func->GetInProcJITEntryPointInfo()->GetInProcNativeEntryPointData();
        nativeEntryPointData->SetSortedLazyBailOutRecordList(this->m_sortedLazyBailoutRecordList);
        nativeEntryPointData->SetLazyBailOutRecordSlotOffset(this->m_func->GetLazyBailOutRecordSlot()->m_offset);
        nativeEntryPointData->SetLazyBailOutThunkOffset(this->m_lazyBailOutThunkOffset);
    }

    if (this->m_func->lazyBailoutProperties.Count() > 0)
    {
        const int count = this->m_func->lazyBailoutProperties.Count();
        Js::PropertyId* lazyBailoutProperties = HeapNewArrayZ(Js::PropertyId, count);
        Js::PropertyId* dstProperties = lazyBailoutProperties;
        this->m_func->lazyBailoutProperties.Map([&](Js::PropertyId propertyId)
        {
            *dstProperties++ = propertyId;
        });
        this->m_func->GetInProcJITEntryPointInfo()->GetJitTransferData()->SetLazyBailoutProperties(lazyBailoutProperties, count);
    }
}